

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O1

size_t __thiscall
jsoncons::detail::write_double::operator()
          (write_double *this,double val,
          string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *result)

{
  float_chars_format fVar1;
  bool bVar2;
  uint uVar3;
  json_runtime_error<std::invalid_argument,_void> *pjVar4;
  char number_buffer [200];
  string local_108;
  char local_e8 [208];
  
  fVar1 = this->float_format_;
  if (fVar1 == general) {
    if (this->precision_ < 1) {
      bVar2 = dtoa_general<jsoncons::string_sink<std::__cxx11::string>>
                        ((int)this->decimal_point_,result);
      if (bVar2) {
        return 0;
      }
      pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"write_double failed.","");
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_108);
      __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
    uVar3 = snprintf(local_e8,200,"%1.*g");
    if ((int)uVar3 < 0) {
      pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"write_double failed.","");
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_108);
      __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
  }
  else if (fVar1 == scientific) {
    if (this->precision_ < 1) {
      bVar2 = dtoa_scientific<jsoncons::string_sink<std::__cxx11::string>>
                        (val,this->decimal_point_,result);
      if (bVar2) {
        return 0;
      }
      pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"write_double failed.","");
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_108);
      __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
    uVar3 = snprintf(local_e8,200,"%1.*e");
    if ((int)uVar3 < 0) {
      pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"write_double failed.","");
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_108);
      __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
  }
  else {
    if (fVar1 != fixed) {
      pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"write_double failed.","");
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_108);
      __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
    if (this->precision_ < 1) {
      bVar2 = dtoa_fixed<jsoncons::string_sink<std::__cxx11::string>>
                        ((int)this->decimal_point_,result);
      if (bVar2) {
        return 0;
      }
      pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"write_double failed.","");
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_108);
      __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
    uVar3 = snprintf(local_e8,200,"%1.*f");
    if ((int)uVar3 < 0) {
      pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"write_double failed.","");
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_108);
      __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
  }
  dump_buffer<jsoncons::string_sink<std::__cxx11::string>>
            (local_e8,(ulong)uVar3,this->decimal_point_,result);
  return 0;
}

Assistant:

std::size_t operator()(double val, Result& result)
        {
            std::size_t count = 0;

            char number_buffer[200];
            int length = 0;

            switch (float_format_)
            {
            case float_chars_format::fixed:
                {
                    if (precision_ > 0)
                    {
                        length = snprintf(number_buffer, sizeof(number_buffer), "%1.*f", precision_, val);
                        if (length < 0)
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                        dump_buffer(number_buffer, length, decimal_point_, result);
                    }
                    else
                    {
                        if (!dtoa_fixed(val, decimal_point_, result))
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                    }
                }
                break;
            case float_chars_format::scientific:
                {
                    if (precision_ > 0)
                    {
                        length = snprintf(number_buffer, sizeof(number_buffer), "%1.*e", precision_, val);
                        if (length < 0)
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                        dump_buffer(number_buffer, length, decimal_point_, result);
                    }
                    else
                    {
                        if (!dtoa_scientific(val, decimal_point_, result))
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                    }
                }
                break;
            case float_chars_format::general:
                {
                    if (precision_ > 0)
                    {
                        length = snprintf(number_buffer, sizeof(number_buffer), "%1.*g", precision_, val);
                        if (length < 0)
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                        dump_buffer(number_buffer, length, decimal_point_, result);
                    }
                    else
                    {
                        if (!dtoa_general(val, decimal_point_, result))
                        {
                            JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                        }
                    }             
                    break;
                }
                default:
                    JSONCONS_THROW(json_runtime_error<std::invalid_argument>("write_double failed."));
                    break;
            }
            return count;
        }